

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_window.c
# Opt level: O0

void line_layer_update(ugui_layer_t *layer,void *graphics_ctx,void *layer_ctx)

{
  ushort uVar1;
  ushort uVar2;
  ugui_rect_t *puVar3;
  ugui_point_t local_64;
  ugui_point_t local_60;
  ugui_point_t local_5c;
  ugui_point_t local_58;
  ugui_point_t local_50;
  ugui_point_t local_4c;
  ugui_point_t local_48;
  ugui_point_t local_40;
  ugui_point_t local_3c;
  ugui_point_t local_38;
  ugui_point_t local_34;
  int h;
  int w;
  ugui_rect_t *bounds;
  void *layer_ctx_local;
  void *graphics_ctx_local;
  ugui_layer_t *layer_local;
  
  puVar3 = ugui_layer_get_bounds(layer);
  uVar1 = puVar3->w;
  uVar2 = puVar3->h;
  local_34 = (ugui_point_t)((uint)(uVar2 / 2) << 0x10);
  local_38.y = uVar2 / 2;
  local_38.x = uVar1 - 1;
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,local_34,local_38);
  local_3c.y = 0;
  local_3c.x = uVar1 / 2;
  local_40.y = uVar2 - 1;
  local_40.x = uVar1 / 2;
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,local_3c,local_40);
  local_48.y = uVar2 / 2;
  local_48.x = uVar1 - 1;
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,(ugui_point_t)0x0,local_48);
  local_4c = (ugui_point_t)((uint)(ushort)(uVar2 - 1) << 0x10);
  local_50.y = uVar2 / 2;
  local_50.x = uVar1 - 1;
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,local_4c,local_50);
  local_58.y = uVar2 - 1;
  local_58.x = uVar1 / 2;
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,(ugui_point_t)0x0,local_58);
  local_5c.y = uVar2 - 1;
  local_5c.x = uVar1 / 2;
  local_60.y = 0;
  local_60.x = uVar1 - 1;
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,local_5c,local_60);
  local_64.y = uVar2 / 2;
  local_64.x = uVar1 / 2;
  ugui_graphics_draw_text
            ((ugui_graphics_t *)graphics_ctx,"test",&font_robotomono_regular_18,local_64);
  ugui_layer_set_dirty(layer);
  return;
}

Assistant:

static void line_layer_update(ugui_layer_t* layer, void* graphics_ctx, void* layer_ctx)
{
	ugui_rect_t* bounds = ugui_layer_get_bounds(layer);

	int w = bounds->w;
	int h = bounds->h;

	//Horizontal
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = 0, .y = h / 2
	}, (ugui_point_t) {
		.x = w - 1, .y = h / 2
	});

	//Vertical
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = w / 2, .y = 0
	}, (ugui_point_t) {
		.x = w / 2, .y = h - 1
	});

	//Diagonal gentle down
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = 0, .y = 0
	}, (ugui_point_t) {
		.x = w - 1, .y = h / 2
	});

	//Diagonal gentle up
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = 0, .y = h - 1
	}, (ugui_point_t) {
		.x = w - 1, .y = h / 2
	});

	//Diagonal sharp down
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = 0, .y = 0
	}, (ugui_point_t) {
		.x = w / 2, .y = h - 1
	});

	//Diagonal sharp up
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = w / 2, .y = h - 1
	}, (ugui_point_t) {
		.x = w - 1, .y = 0
	});

	ugui_graphics_draw_text(graphics_ctx,
	                        "test",
	                        &font_robotomono_regular_18,
	(ugui_point_t) {
		.x = w / 2, .y = h / 2
	});

	ugui_layer_set_dirty(layer);
}